

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.hpp
# Opt level: O1

string * __thiscall KV::KeyValues::getKey_abi_cxx11_(string *__return_storage_ptr__,KeyValues *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->key;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (psVar1 == (string *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getKey() const { return ( key ) ? *key : std::string(); }